

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O3

void copyhdu(void)

{
  int iVar1;
  int status;
  fitsfile *infptr;
  fitsfile *outfptr;
  int hdutype;
  char outfilename [13];
  char infilename [13];
  int local_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_34 [4];
  char local_30 [16];
  undefined5 local_20;
  undefined3 uStack_1b;
  undefined5 uStack_18;
  
  uStack_18 = 0x7469662e;
  local_20 = 0x7473657461;
  uStack_1b = 0x6c6966;
  builtin_strncpy(local_30 + 8,".fit",5);
  builtin_strncpy(local_30,"btestfil",8);
  local_4c = 0;
  remove(local_30);
  iVar1 = ffopentest(10,&local_48,&local_20,0,&local_4c);
  if (iVar1 != 0) {
    printerror(local_4c);
  }
  iVar1 = ffinit(&local_40,local_30,&local_4c);
  if (iVar1 != 0) {
    printerror(local_4c);
  }
  iVar1 = ffcopy(local_48,local_40,0,&local_4c);
  if (iVar1 != 0) {
    printerror(local_4c);
  }
  iVar1 = ffmahd(local_48,3,local_34,&local_4c);
  if (iVar1 != 0) {
    printerror(local_4c);
  }
  iVar1 = ffcopy(local_48,local_40,0,&local_4c);
  if (iVar1 != 0) {
    printerror(local_4c);
  }
  iVar1 = ffclos(local_40,&local_4c);
  if ((iVar1 == 0) && (iVar1 = ffclos(local_48,&local_4c), iVar1 == 0)) {
    return;
  }
  printerror(local_4c);
  return;
}

Assistant:

void copyhdu( void)
{
    /********************************************************************/
    /* copy the 1st and 3rd HDUs from the input file to a new FITS file */
    /********************************************************************/
    fitsfile *infptr;      /* pointer to the FITS file, defined in fitsio.h */
    fitsfile *outfptr;                 /* pointer to the new FITS file      */

    char infilename[]  = "atestfil.fit";  /* name for existing FITS file   */
    char outfilename[] = "btestfil.fit";  /* name for new FITS file        */

    int status, morekeys, hdutype;

    status = 0;

    remove(outfilename);            /* Delete old file if it already exists */

    /* open the existing FITS file */
    if ( fits_open_file(&infptr, infilename, READONLY, &status) ) 
         printerror( status );

    if (fits_create_file(&outfptr, outfilename, &status)) /*create FITS file*/
         printerror( status );           /* call printerror if error occurs */

    /* copy the primary array from the input file to the output file */
    morekeys = 0;     /* don't reserve space for additional keywords */
    if ( fits_copy_hdu(infptr, outfptr, morekeys, &status) )
         printerror( status );

    /* move to the 3rd HDU in the input file */
    if ( fits_movabs_hdu(infptr, 3, &hdutype, &status) )
         printerror( status );

    /* copy 3rd HDU from the input file to the output file (to 2nd HDU) */
    if ( fits_copy_hdu(infptr, outfptr, morekeys, &status) )
         printerror( status );

    if (fits_close_file(outfptr, &status) ||
        fits_close_file(infptr, &status)) /* close files */
         printerror( status );

    return;
}